

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

void __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
::splitFallback(BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::UserGeometry>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::UserGeometry,_embree::Object>,_embree::Scene::BuildProgressMonitorInterface>
                *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  BBox1f BVar1;
  BBox1f BVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  PrimRefVector pmVar7;
  unsigned_long uVar8;
  ulong uVar9;
  PrimRefMB *pPVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float local_178;
  float fStack_174;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  undefined1 local_148 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  undefined1 local_128 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  undefined1 local_108 [16];
  undefined8 local_f8;
  long lStack_f0;
  long local_e8;
  ulong uStack_e0;
  float local_d8;
  undefined8 local_d4;
  float local_cc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined1 local_b8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a8;
  undefined1 local_98 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined1 local_78 [16];
  undefined8 local_68;
  long lStack_60;
  long local_58;
  ulong uStack_50;
  float local_48;
  undefined8 local_44;
  float local_3c;
  
  pmVar7 = set->prims;
  uVar8 = (set->super_PrimInfoMB).object_range._begin;
  uVar9 = (set->super_PrimInfoMB).object_range._end;
  uVar16 = uVar8 + uVar9 + 1 >> 1;
  local_c8 = _DAT_01f45a30;
  local_b8 = _DAT_01f45a40;
  local_a8 = _DAT_01f45a30;
  local_98 = _DAT_01f45a40;
  local_88 = _DAT_01f45a30;
  local_78 = _DAT_01f45a40;
  local_68 = 0;
  lStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0.0;
  local_44 = 0x3f8000003f800000;
  local_3c = 0.0;
  lVar12 = uVar8 * 0x50 + 0x44;
  fVar19 = 1.0;
  uVar14 = 0;
  lVar11 = 1;
  while (lVar13 = lVar11, (uVar8 + lVar13) - 1 < uVar16) {
    pPVar10 = pmVar7->items;
    auVar3 = *(undefined1 (*) [16])((long)pPVar10 + lVar12 + -0x44);
    auVar4 = *(undefined1 (*) [16])((long)pPVar10 + lVar12 + -0x34);
    auVar5 = *(undefined1 (*) [16])((long)pPVar10 + lVar12 + -0x24);
    auVar6 = *(undefined1 (*) [16])((long)pPVar10 + lVar12 + -0x14);
    local_a8.m128 = (__m128)minps(local_a8.m128,auVar5);
    local_c8.m128 = (__m128)minps(local_c8.m128,auVar3);
    local_98 = maxps(local_98,auVar6);
    local_b8 = maxps(local_b8,auVar4);
    fVar20 = auVar4._0_4_ * 0.5 + auVar6._0_4_ * 0.5 + auVar3._0_4_ * 0.5 + auVar5._0_4_ * 0.5;
    fVar21 = auVar4._4_4_ * 0.5 + auVar6._4_4_ * 0.5 + auVar3._4_4_ * 0.5 + auVar5._4_4_ * 0.5;
    fVar22 = auVar4._8_4_ * 0.5 + auVar6._8_4_ * 0.5 + auVar3._8_4_ * 0.5 + auVar5._8_4_ * 0.5;
    fVar23 = auVar4._12_4_ * 0.5 + auVar6._12_4_ * 0.5 + auVar3._12_4_ * 0.5 + auVar5._12_4_ * 0.5;
    local_58 = local_58 + (ulong)*(uint *)((long)pPVar10 + lVar12 + -0x18);
    uVar15 = (ulong)*(uint *)((long)pPVar10 + lVar12 + -8);
    auVar5._4_4_ = fVar21;
    auVar5._0_4_ = fVar20;
    auVar5._8_4_ = fVar22;
    auVar5._12_4_ = fVar23;
    local_88.m128 = (__m128)minps(local_88.m128,auVar5);
    auVar6._4_4_ = fVar21;
    auVar6._0_4_ = fVar20;
    auVar6._8_4_ = fVar22;
    auVar6._12_4_ = fVar23;
    local_78 = maxps(local_78,auVar6);
    fVar20 = *(float *)((long)pPVar10 + lVar12 + -4);
    if (fVar20 <= fVar19) {
      fVar19 = fVar20;
    }
    fVar21 = *(float *)((long)&(pPVar10->lbounds).bounds0.lower.field_0 + lVar12);
    fVar22 = fVar21;
    if (fVar21 <= local_3c) {
      fVar22 = local_3c;
    }
    if (uVar14 < uVar15) {
      uVar14 = uVar15;
      uStack_50 = uVar15;
      local_48 = fVar20;
      local_44._0_4_ = fVar21;
    }
    local_44 = CONCAT44(fVar19,(float)local_44);
    lVar12 = lVar12 + 0x50;
    lStack_60 = lVar13;
    local_3c = fVar22;
    lVar11 = lVar13 + 1;
  }
  local_158 = _DAT_01f45a30;
  local_148 = _DAT_01f45a40;
  local_138 = _DAT_01f45a30;
  local_128 = _DAT_01f45a40;
  local_118 = _DAT_01f45a30;
  local_108 = _DAT_01f45a40;
  local_f8 = 0;
  lStack_f0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0.0;
  local_d4 = 0x3f8000003f800000;
  local_cc = 0.0;
  lVar12 = uVar16 * 0x50 + 0x44;
  fVar19 = 1.0;
  uVar14 = 0;
  lVar11 = 1;
  while (lVar13 = lVar11, (lVar13 + uVar16) - 1 < uVar9) {
    pPVar10 = pmVar7->items;
    auVar3 = *(undefined1 (*) [16])((long)pPVar10 + lVar12 + -0x44);
    auVar4 = *(undefined1 (*) [16])((long)pPVar10 + lVar12 + -0x34);
    auVar5 = *(undefined1 (*) [16])((long)pPVar10 + lVar12 + -0x24);
    auVar6 = *(undefined1 (*) [16])((long)pPVar10 + lVar12 + -0x14);
    local_138.m128 = (__m128)minps(local_138.m128,auVar5);
    local_158.m128 = (__m128)minps(local_158.m128,auVar3);
    local_128 = maxps(local_128,auVar6);
    local_148 = maxps(local_148,auVar4);
    fVar20 = auVar4._0_4_ * 0.5 + auVar6._0_4_ * 0.5 + auVar3._0_4_ * 0.5 + auVar5._0_4_ * 0.5;
    fVar21 = auVar4._4_4_ * 0.5 + auVar6._4_4_ * 0.5 + auVar3._4_4_ * 0.5 + auVar5._4_4_ * 0.5;
    fVar22 = auVar4._8_4_ * 0.5 + auVar6._8_4_ * 0.5 + auVar3._8_4_ * 0.5 + auVar5._8_4_ * 0.5;
    fVar23 = auVar4._12_4_ * 0.5 + auVar6._12_4_ * 0.5 + auVar3._12_4_ * 0.5 + auVar5._12_4_ * 0.5;
    local_e8 = local_e8 + (ulong)*(uint *)((long)pPVar10 + lVar12 + -0x18);
    uVar15 = (ulong)*(uint *)((long)pPVar10 + lVar12 + -8);
    auVar3._4_4_ = fVar21;
    auVar3._0_4_ = fVar20;
    auVar3._8_4_ = fVar22;
    auVar3._12_4_ = fVar23;
    local_118.m128 = (__m128)minps(local_118.m128,auVar3);
    auVar4._4_4_ = fVar21;
    auVar4._0_4_ = fVar20;
    auVar4._8_4_ = fVar22;
    auVar4._12_4_ = fVar23;
    local_108 = maxps(local_108,auVar4);
    fVar20 = *(float *)((long)pPVar10 + lVar12 + -4);
    if (fVar20 <= fVar19) {
      fVar19 = fVar20;
    }
    fVar21 = *(float *)((long)&(pPVar10->lbounds).bounds0.lower.field_0 + lVar12);
    fVar22 = fVar21;
    if (fVar21 <= local_cc) {
      fVar22 = local_cc;
    }
    if (uVar14 < uVar15) {
      uVar14 = uVar15;
      uStack_e0 = uVar15;
      local_d8 = fVar20;
      local_d4._0_4_ = fVar21;
    }
    local_d4 = CONCAT44(fVar19,(float)local_d4);
    lVar12 = lVar12 + 0x50;
    lStack_f0 = lVar13;
    local_cc = fVar22;
    lVar11 = lVar13 + 1;
  }
  BVar1 = (set->super_PrimInfoMB).time_range;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
            (&lset->super_PrimInfoMB,
             (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_c8.field_1);
  lset->prims = pmVar7;
  (lset->super_PrimInfoMB).object_range._begin = uVar8;
  (lset->super_PrimInfoMB).object_range._end = uVar16;
  BVar2 = (lset->super_PrimInfoMB).time_range;
  fVar19 = BVar2.lower;
  fVar20 = BVar2.upper;
  local_178 = BVar1.lower;
  fStack_174 = BVar1.upper;
  uVar17 = -(uint)(fVar19 < local_178);
  uVar18 = -(uint)(fVar20 < fStack_174);
  (lset->super_PrimInfoMB).time_range =
       (BBox1f)(CONCAT44(~uVar18 & (uint)fStack_174,~uVar17 & (uint)fVar19) |
               CONCAT44((uint)fVar20 & uVar18,(uint)local_178 & uVar17));
  pmVar7 = set->prims;
  BVar1 = (set->super_PrimInfoMB).time_range;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
            (&rset->super_PrimInfoMB,
             (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_158.field_1);
  rset->prims = pmVar7;
  (rset->super_PrimInfoMB).object_range._begin = uVar16;
  (rset->super_PrimInfoMB).object_range._end = uVar9;
  BVar2 = (rset->super_PrimInfoMB).time_range;
  fVar19 = BVar2.lower;
  fVar20 = BVar2.upper;
  local_178 = BVar1.lower;
  fStack_174 = BVar1.upper;
  uVar17 = -(uint)(fVar19 < local_178);
  uVar18 = -(uint)(fVar20 < fStack_174);
  (rset->super_PrimInfoMB).time_range =
       (BBox1f)(CONCAT44(~uVar18 & (uint)fStack_174,~uVar17 & (uint)fVar19) |
               CONCAT44((uint)fVar20 & uVar18,(uint)local_178 & uVar17));
  return;
}

Assistant:

void splitFallback(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            mvector<PrimRefMB>& prims = *set.prims;

            const size_t begin = set.begin();
            const size_t end   = set.end();
            const size_t center = (begin + end + 1) / 2;

            PrimInfoMB linfo = empty;
            for (size_t i=begin; i<center; i++)
              linfo.add_primref(prims[i]);

            PrimInfoMB rinfo = empty;
            for (size_t i=center; i<end; i++)
              rinfo.add_primref(prims[i]);

            new (&lset) SetMB(linfo,set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(rinfo,set.prims,range<size_t>(center,end  ),set.time_range);
          }